

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O1

void test_invoke_obj<int_const,true,int_C::*const&,D_const>(long r,long *param_2,long param_3)

{
  _Elt_pointer ptVar1;
  ostream *poVar2;
  test_context *scope_1;
  _Map_pointer pptVar3;
  _Elt_pointer ptVar4;
  _Elt_pointer ptVar5;
  test_context *scope;
  char local_61;
  test_context local_60;
  long *local_48;
  long local_40;
  long local_38;
  
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x7d;
  local_60.expr =
       "::addressof(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r)";
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  if (*param_2 + param_3 != r) {
    test_report_info<void>::failures = test_report_info<void>::failures + 1;
    local_48 = param_2;
    local_40 = r;
    local_38 = param_3;
    poVar2 = operator<<((ostream *)&std::cerr,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is false\n",10);
    ptVar1 = test_scope_stack<void>::stack.
             super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur !=
        test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      pptVar3 = test_scope_stack<void>::stack.
                super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      ptVar5 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      ptVar4 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
        poVar2 = operator<<((ostream *)&std::cerr,ptVar4);
        local_61 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_61,1);
        ptVar4 = ptVar4 + 1;
        if (ptVar4 == ptVar5) {
          ptVar4 = pptVar3[1];
          pptVar3 = pptVar3 + 1;
          ptVar5 = ptVar4 + 0x15;
        }
      } while (ptVar4 != ptVar1);
    }
    local_61 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_61,1);
    param_3 = local_38;
    param_2 = local_48;
    r = local_40;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x7e;
  local_60.expr =
       "::addressof(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r)"
  ;
  if (param_3 + *param_2 != r) {
    test_report_info<void>::failures = test_report_info<void>::failures + 1;
    poVar2 = operator<<((ostream *)&std::cerr,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is false\n",10);
    ptVar1 = test_scope_stack<void>::stack.
             super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur !=
        test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      ptVar4 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pptVar3 = test_scope_stack<void>::stack.
                super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      ptVar5 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
        poVar2 = operator<<((ostream *)&std::cerr,ptVar4);
        local_61 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_61,1);
        ptVar4 = ptVar4 + 1;
        if (ptVar4 == ptVar5) {
          ptVar4 = pptVar3[1];
          pptVar3 = pptVar3 + 1;
          ptVar5 = ptVar4 + 0x15;
        }
      } while (ptVar4 != ptVar1);
    }
    local_61 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_61,1);
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 6;
  return;
}

Assistant:

void test_invoke_obj(
    R&& r, std::integral_constant<bool, IsNothrow>,
    F&& f, A1&& a1)
{
    CHECK(::addressof(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r));
    CHECK(::addressof(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r));
    CHECK(std::is_same<decltype(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))), R&&>::value);
    CHECK(std::is_same<decltype(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))), R&&>::value);
    CHECK(std::is_same<decltype(eggs::invoke_r<void>(std::forward<F>(f), std::forward<A1>(a1))), void>::value);
    CHECK(noexcept(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
    CHECK(noexcept(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
    CHECK(noexcept(eggs::invoke_r<void>(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
}